

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedType.cpp
# Opt level: O0

bool __thiscall hdc::NamedType::equals(NamedType *this,Type *other)

{
  ASTKind AVar1;
  ASTKind AVar2;
  IdentifierExpression *pIVar3;
  Symbol *this_00;
  Symbol *this_01;
  void *pvVar4;
  void *pvVar5;
  NamedType *n;
  Symbol *s2;
  Symbol *s1;
  Type *other_local;
  NamedType *this_local;
  
  AVar1 = (this->super_Type).super_ASTNode.kind;
  AVar2 = ASTNode::getKind(&other->super_ASTNode);
  if (AVar1 == AVar2) {
    pIVar3 = getName(this);
    this_00 = IdentifierExpression::getSymbol(pIVar3);
    pIVar3 = getName((NamedType *)other);
    this_01 = IdentifierExpression::getSymbol(pIVar3);
    if ((this_00 != (Symbol *)0x0) && (this_01 != (Symbol *)0x0)) {
      pvVar4 = Symbol::getDescriptor(this_00);
      pvVar5 = Symbol::getDescriptor(this_01);
      return pvVar4 == pvVar5;
    }
  }
  return false;
}

Assistant:

bool NamedType::equals(Type *other) {
    Symbol* s1;
    Symbol* s2;
    NamedType* n;

    if (kind == other->getKind()) {
        n = (NamedType*) other;

        s1 = getName()->getSymbol();
        s2 = n->getName()->getSymbol();

        if (s1 != nullptr && s2 != nullptr) {
            return s1->getDescriptor() == s2->getDescriptor();
        }
    }

    return false;
}